

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O3

QString * qt_ACE_do(QString *__return_storage_ptr__,QString *domain,AceOperation op,
                   AceLeadingDot dot,AceProcessingOptions options)

{
  char16_t *pcVar1;
  ushort uVar2;
  char16_t cVar3;
  char32_t cVar4;
  Data *pDVar5;
  bool bVar6;
  bool bVar7;
  IdnaStatus IVar8;
  QString *pQVar9;
  QArrayData *pQVar10;
  int iVar11;
  undefined1 *from;
  char16_t *pcVar12;
  long lVar13;
  QString *__range1;
  char32_t ucs4;
  QArrayData *pQVar14;
  char16_t *pcVar15;
  long in_FS_OFFSET;
  QLatin1StringView needle;
  QStringView label;
  QStringView haystack;
  QStringView aceDomain;
  QStringView in;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  QString local_88;
  QStringView local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = (QArrayData *)(domain->d).size;
  if (pQVar10 == (QArrayData *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_002645ca;
  }
  local_a8.d.ptr = (domain->d).ptr;
  lVar13 = 0;
  iVar11 = 0;
  do {
    uVar2 = *(ushort *)((long)local_a8.d.ptr + lVar13);
    if (0x7f < uVar2) break;
    if ((uVar2 == 0x2d) || (uVar2 == 0x5f)) {
LAB_00263c0b:
      iVar11 = iVar11 + 1;
    }
    else {
      if (0x2f < uVar2) {
        if (uVar2 < 0x3a || (ushort)(uVar2 - 0x61) < 0x1a) goto LAB_00263c0b;
        break;
      }
      iVar11 = iVar11 + (uint)(uVar2 == 0x2e);
      if (uVar2 != 0x2e) break;
    }
    lVar13 = lVar13 + 2;
  } while ((long)pQVar10 * 2 != lVar13);
  pQVar14 = (QArrayData *)(long)iVar11;
  if (pQVar10 == pQVar14) {
    local_a8.d.d = (domain->d).d;
    local_a8.d.size = (qsizetype)pQVar10;
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_a8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
LAB_00263eef:
    local_c8.d.d = local_a8.d.d;
    local_c8.d.ptr = local_a8.d.ptr;
    local_c8.d.size = local_a8.d.size;
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      bVar7 = true;
      goto LAB_00263f5c;
    }
    if ((QArrayData *)local_a8.d.size != (QArrayData *)0x0) goto LAB_00263f70;
  }
  else {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    local_a8.d.size = 0;
    QString::reallocData(&local_a8,(qsizetype)pQVar10,KeepSize);
    if ((&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) &&
       (*(qsizetype *)((long)local_a8.d.d + 8) != 0)) {
      *(byte *)&(((ArrayOptions *)((long)local_a8.d.d + 4))->
                super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(((ArrayOptions *)((long)local_a8.d.d + 4))->
                 super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    pcVar12 = (domain->d).ptr;
    if ((QChar *)pcVar12 == (QChar *)0x0) {
      pcVar12 = &QString::_empty;
    }
    QString::append(&local_a8,(QChar *)pcVar12,(qsizetype)pQVar14);
    lVar13 = (domain->d).size - (long)pQVar14;
    if (lVar13 < 1) goto LAB_00263eef;
    pcVar15 = (domain->d).ptr + (long)pQVar14;
    bVar7 = true;
    pcVar12 = pcVar15;
    do {
      pcVar1 = pcVar12 + 1;
      cVar3 = *pcVar12;
      ucs4 = (char32_t)(ushort)cVar3;
      if ((cVar3 & 0xf800U) == 0xd800) {
        ucs4 = L'�';
        if ((((cVar3 & 0xdc00U) == 0xd800) && (pcVar1 < pcVar15 + lVar13)) &&
           ((*pcVar1 & 0xfc00U) == 0xdc00)) {
          ucs4 = (uint)(ushort)cVar3 * 0x400 + (uint)(ushort)*pcVar1 + L'\xfca02400';
        }
LAB_00263db5:
        IVar8 = QUnicodeTables::idnaStatus(ucs4);
        pQVar9 = (QString *)
                 (*(code *)(&DAT_004ccca0 + *(int *)(&DAT_004ccca0 + (ulong)IVar8 * 4)))();
        return pQVar9;
      }
      if ((ushort)cVar3 < 0x80) {
        cVar4 = ucs4 | 0x20;
        if (0x19 < (ushort)cVar3 - 0x41) {
          cVar4 = ucs4;
        }
        if (((cVar4 != L'-') && (cVar4 != L'_')) &&
           ((9 < (uint)(cVar4 + L'\xffffffd0') &&
            (ucs4 = cVar4, cVar4 != L'.' && 0x19 < (uint)(cVar4 + L'\xffffff9f')))))
        goto LAB_00263db5;
        QString::append(&local_a8,(QChar)(char16_t)cVar4);
      }
      else {
        if (ucs4 != L'ẞ' ||
            ((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                   super_QFlagsStorage<QUrl::AceProcessingOption>.i & 2) == 0) goto LAB_00263db5;
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = L"ss";
        local_58.d.size = 2;
        QString::append(&local_a8,&local_58);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar7 = false;
      }
      pcVar12 = pcVar1;
    } while (pcVar1 < pcVar15 + lVar13);
    local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (bVar7) goto LAB_00263eef;
    bVar7 = false;
    QString::normalized(&local_c8,&local_a8,NormalizationForm_C,Unicode_Unassigned);
LAB_00263f5c:
    if ((QArrayData *)local_c8.d.size != (QArrayData *)0x0) {
      if (!bVar7) {
        local_88.d.d = (Data *)CONCAT53(local_88.d.d._3_5_,0x10000);
        from = (undefined1 *)0x0;
        do {
          pQVar10 = (QArrayData *)
                    QString::indexOf(&local_c8,(QChar)0x2e,(qsizetype)from,CaseSensitive);
          if (pQVar10 == (QArrayData *)0xffffffffffffffff) {
            pQVar10 = (QArrayData *)local_c8.d.size;
          }
          if ((long)pQVar10 - (long)from != 0) {
            local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::QString(&local_58,(QChar *)(local_c8.d.ptr + (long)from),
                             (long)pQVar10 - (long)from);
            bVar7 = anon_unknown.dwarf_538cc0::DomainValidityChecker::checkLabel
                              ((DomainValidityChecker *)&local_88,&local_58,options);
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (!bVar7) goto LAB_002642ef;
          }
          from = (undefined1 *)((long)&(pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + 1);
        } while (pQVar10 != (QArrayData *)local_c8.d.size);
        local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_size = local_c8.d.size;
        local_68.m_data = local_c8.d.ptr;
        pQVar10 = (QArrayData *)0x0;
        local_58.d.size = 0;
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        local_88.d.size = 0;
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        do {
          pQVar14 = (QArrayData *)
                    QStringView::indexOf(&local_68,(QChar)0x2e,(qsizetype)pQVar10,CaseSensitive);
          pDVar5 = local_58.d.d;
          if (pQVar14 == (QArrayData *)0xffffffffffffffff) {
            pQVar14 = (QArrayData *)local_68.m_size;
          }
          if ((long)pQVar14 - (long)pQVar10 == 0) {
            if (pQVar10 == (QArrayData *)local_68.m_size) {
LAB_002643d5:
              local_e8.d.size = local_88.d.size;
              local_e8.d.ptr = local_88.d.ptr;
              local_e8.d.d = local_88.d.d;
              local_88.d.d = (Data *)0x0;
              local_88.d.ptr = (char16_t *)0x0;
              local_88.d.size = 0;
              goto LAB_00264406;
            }
            if ((dot == ForbidLeadingDot) || (0 < (long)pQVar10)) goto LAB_002643c2;
          }
          else {
            pcVar12 = local_68.m_data + (long)pQVar10;
            if (local_58.d.ptr != (char16_t *)0x0) {
              local_58.d.d = (Data *)0x0;
              local_58.d.ptr = (char16_t *)0x0;
              local_58.d.size = 0;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                }
              }
            }
            in.m_data = pcVar12;
            in.m_size = (long)pQVar14 - (long)pQVar10;
            qt_punycodeEncoder(in,&local_58);
            if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) goto LAB_002643c2;
            QString::append(&local_88,&local_58);
            if (pQVar14 == (QArrayData *)local_68.m_size) goto LAB_002643d5;
          }
          QString::append(&local_88,(QChar)0x2e);
          pQVar10 = (QArrayData *)
                    ((long)&(pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1);
        } while( true );
      }
LAB_00263f70:
      local_e8.d.d = local_c8.d.d;
      local_e8.d.ptr = local_c8.d.ptr;
      local_e8.d.size = local_c8.d.size;
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00263fa7;
    }
  }
LAB_002642ef:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  goto LAB_0026434e;
LAB_002643c2:
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
LAB_00264406:
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00263fa7:
  if ((QArrayData *)local_e8.d.size == (QArrayData *)0x0) {
LAB_002640b5:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_58.d.ptr = local_e8.d.ptr;
    pQVar10 = (QArrayData *)0x0;
    bVar7 = false;
    local_58.d.d = (Data *)local_e8.d.size;
    do {
      pQVar14 = (QArrayData *)
                QStringView::indexOf
                          ((QStringView *)&local_58,(QChar)0x2e,(qsizetype)pQVar10,CaseSensitive);
      pDVar5 = local_58.d.d;
      if (pQVar14 == (QArrayData *)0xffffffffffffffff) {
        pQVar14 = &(local_58.d.d)->super_QArrayData;
      }
      lVar13 = (long)pQVar14 - (long)pQVar10;
      if (lVar13 == 0) {
        if (pQVar10 == &(local_58.d.d)->super_QArrayData) break;
        if ((dot == ForbidLeadingDot) || (0 < (long)pQVar10)) goto LAB_002640b5;
      }
      else {
        pcVar12 = local_58.d.ptr + (long)pQVar10;
        label.m_data = pcVar12;
        label.m_size = lVar13;
        bVar6 = validateAsciiLabel(label);
        if (!bVar6) goto LAB_002640b5;
        bVar6 = bVar7 == false;
        bVar7 = true;
        if (bVar6) {
          needle.m_data = "xn--";
          needle.m_size = 4;
          haystack.m_data = pcVar12;
          haystack.m_size = lVar13;
          bVar7 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
        }
      }
      pQVar10 = (QArrayData *)((long)&(pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1);
    } while ((long)pQVar10 < (long)pDVar5);
    if (((op == ToAceOnly) || (bVar7 == false)) ||
       ((((uint)options.super_QFlagsStorageHelper<QUrl::AceProcessingOption,_4>.
                super_QFlagsStorage<QUrl::AceProcessingOption>.i & 1) == 0 &&
        (aceDomain.m_data = local_e8.d.ptr, aceDomain.m_size = local_e8.d.size,
        bVar7 = qt_is_idn_enabled(aceDomain), !bVar7)))) {
      (__return_storage_ptr__->d).d = local_e8.d.d;
      (__return_storage_ptr__->d).ptr = local_e8.d.ptr;
      (__return_storage_ptr__->d).size = local_e8.d.size;
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      convertToUnicode(__return_storage_ptr__,&local_e8,options);
    }
  }
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0026434e:
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002645ca:
  __stack_chk_fail();
}

Assistant:

QString qt_ACE_do(const QString &domain, AceOperation op, AceLeadingDot dot,
                  QUrl::AceProcessingOptions options)
{
    if (domain.isEmpty())
        return {};

    bool mappedToAscii;
    const QString mapped = mapDomainName(domain, options, &mappedToAscii);
    const QString normalized =
            mappedToAscii ? mapped : mapped.normalized(QString::NormalizationForm_C);

    if (normalized.isEmpty())
        return {};

    if (!mappedToAscii && !checkUnicodeName(normalized, options))
        return {};

    bool needsConversionToUnicode;
    const QString aceResult = mappedToAscii ? normalized : convertToAscii(normalized, dot);
    if (aceResult.isEmpty() || !checkAsciiDomainName(aceResult, dot, &needsConversionToUnicode))
        return {};

    if (op == ToAceOnly || !needsConversionToUnicode
        || (!options.testFlag(QUrl::IgnoreIDNWhitelist) && !qt_is_idn_enabled(aceResult))) {
        return aceResult;
    }

    return convertToUnicode(aceResult, options);
}